

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O0

Vector3f pbrt::SampleTrowbridgeReitzVisibleArea(Vector3f *w,Float alpha_x,Float alpha_y,Point2f *u)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  Tuple3<pbrt::Vector3,_float> TVar3;
  int iVar4;
  float *pfVar5;
  Tuple2<pbrt::Point2,_float> *in_RSI;
  long *in_FS_OFFSET;
  float in_XMM0_Da;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 extraout_var_01 [56];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  float in_XMM1_Da;
  Vector3<float> VVar21;
  Vector3f nh;
  Float s;
  Float t2;
  Float t1;
  Float phi;
  Float r;
  Vector3f T2;
  Vector3f T1;
  Vector3f wh;
  float in_stack_fffffffffffffde8;
  float fVar22;
  float in_stack_fffffffffffffdec;
  float fVar23;
  Vector3<float> *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  undefined4 in_stack_fffffffffffffe00;
  float fVar24;
  undefined4 in_stack_fffffffffffffe04;
  Tuple3<pbrt::Vector3,_float> *t;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  float s_00;
  float local_194;
  Vector3<float> local_190 [2];
  _lambda_pbrt__StatsAccumulator___1_ local_171;
  undefined8 local_170;
  float local_168;
  undefined8 local_160;
  float local_158;
  float local_150;
  float local_14c;
  undefined8 local_148;
  float local_140;
  undefined8 local_138;
  float local_130;
  undefined8 local_128;
  float local_120;
  undefined8 local_118;
  float local_110;
  undefined8 local_108;
  float local_100;
  undefined8 local_f8;
  float local_f0;
  undefined8 local_e8;
  float local_e0;
  undefined8 local_d8;
  float local_d0;
  float local_cc;
  float local_c8;
  float local_c4;
  float local_c0;
  float local_bc;
  undefined8 local_b8;
  float local_b0;
  undefined8 local_a8;
  float local_a0;
  Tuple3<pbrt::Vector3,_float> local_98;
  undefined8 local_88;
  float local_80;
  undefined8 local_68;
  float local_60;
  Tuple3<pbrt::Vector3,_float> local_5c;
  undefined8 local_50;
  float local_48;
  undefined8 local_34;
  float local_2c;
  Tuple2<pbrt::Point2,_float> *local_28;
  float local_20;
  float local_1c;
  undefined1 extraout_var [60];
  undefined1 auVar20 [56];
  undefined1 extraout_var_00 [56];
  
  auVar20 = (undefined1  [56])0x0;
  local_28 = in_RSI;
  local_20 = in_XMM1_Da;
  local_1c = in_XMM0_Da;
  Vector3<float>::Vector3
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec,in_stack_fffffffffffffde8,0.0);
  VVar21 = Normalize<float>((Vector3<float> *)
                            CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  local_48 = VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar8._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar8._8_56_ = auVar20;
  local_50 = vmovlpd_avx(auVar8._0_16_);
  local_34 = local_50;
  local_2c = local_48;
  if (0.99999 <= local_48) {
    auVar20 = (undefined1  [56])0x0;
    Vector3<float>::Vector3
              (in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec,in_stack_fffffffffffffde8,0.0);
  }
  else {
    auVar20 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
    Vector3<float>::Vector3
              (in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec,in_stack_fffffffffffffde8,0.0);
    VVar21 = Cross<float>((Vector3<float> *)
                          CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                          (Vector3<float> *)
                          CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    local_80 = VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar9._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar9._8_56_ = auVar20;
    local_88 = vmovlpd_avx(auVar9._0_16_);
    local_68 = local_88;
    local_60 = local_80;
    VVar21 = Normalize<float>((Vector3<float> *)
                              CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    local_98.z = VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar10._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar10._8_56_ = auVar20;
    local_98._0_8_ = vmovlpd_avx(auVar10._0_16_);
    local_5c._0_8_ = local_98._0_8_;
    local_5c.z = local_98.z;
  }
  t = &local_5c;
  VVar21 = Cross<float>((Vector3<float> *)
                        CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                        (Vector3<float> *)
                        CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  local_b0 = VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar11._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar11._8_56_ = auVar20;
  local_b8 = vmovlpd_avx(auVar11._0_16_);
  local_a8 = local_b8;
  local_a0 = local_b0;
  auVar12._0_4_ = Tuple2<pbrt::Point2,_float>::operator[](local_28,0);
  auVar12._4_60_ = extraout_var;
  dVar6 = std::sqrt(auVar12._0_8_);
  local_bc = SUB84(dVar6,0);
  local_c0 = Tuple2<pbrt::Point2,_float>::operator[](local_28,1);
  local_c0 = local_c0 * 6.2831855;
  fVar23 = local_bc;
  dVar6 = std::cos((double)(ulong)(uint)local_c0);
  local_c4 = fVar23 * SUB84(dVar6,0);
  fVar24 = local_bc;
  dVar6 = std::sin((double)(ulong)(uint)local_c0);
  local_c8 = fVar24 * SUB84(dVar6,0);
  s_00 = 1.0;
  local_cc = (local_2c + 1.0) * 0.5;
  fVar22 = 1.0 - local_cc;
  auVar2 = vfnmadd213ss_fma(ZEXT416((uint)local_c4),ZEXT416((uint)local_c4),
                            SUB6416(ZEXT464(0x3f800000),0));
  auVar13._0_8_ = std::sqrt(auVar2._0_8_);
  auVar13._8_56_ = extraout_var_00;
  auVar2 = vfmadd213ss_fma(auVar13._0_16_,ZEXT416((uint)fVar22),ZEXT416((uint)(local_cc * local_c8))
                          );
  local_c8 = auVar2._0_4_;
  auVar20 = (undefined1  [56])0x0;
  VVar21 = operator*(s_00,t);
  local_100 = VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar14._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar14._8_56_ = auVar20;
  local_108 = vmovlpd_avx(auVar14._0_16_);
  auVar20 = (undefined1  [56])0x0;
  local_f8 = local_108;
  local_f0 = local_100;
  VVar21 = operator*(s_00,t);
  local_120 = VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar15._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar15._8_56_ = auVar20;
  local_128 = vmovlpd_avx(auVar15._0_16_);
  local_118 = local_128;
  local_110 = local_120;
  VVar21 = Tuple3<pbrt::Vector3,float>::operator+
                     ((Tuple3<pbrt::Vector3,_float> *)CONCAT44(fVar22,fVar24),
                      (Vector3<float> *)CONCAT44(fVar23,in_stack_fffffffffffffdf8));
  local_130 = VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar16._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar16._8_56_ = auVar20;
  auVar7 = auVar16._0_16_;
  local_138 = vmovlpd_avx(auVar7);
  local_14c = 0.0;
  auVar2 = vfnmadd213ss_fma(ZEXT416((uint)local_c4),ZEXT416((uint)local_c4),ZEXT416((uint)s_00));
  auVar2 = vfnmadd213ss_fma(ZEXT416((uint)local_c8),ZEXT416((uint)local_c8),auVar2);
  local_150 = auVar2._0_4_;
  local_e8 = local_138;
  local_e0 = local_130;
  pfVar5 = std::max<float>(&local_14c,&local_150);
  std::sqrt((double)(ulong)(uint)*pfVar5);
  auVar20 = extraout_var_01;
  VVar21 = operator*(s_00,t);
  local_158 = VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar17._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar17._8_56_ = auVar20;
  local_160 = vmovlpd_avx(auVar17._0_16_);
  local_148 = local_160;
  local_140 = local_158;
  VVar21 = Tuple3<pbrt::Vector3,float>::operator+
                     ((Tuple3<pbrt::Vector3,_float> *)CONCAT44(fVar22,fVar24),
                      (Vector3<float> *)CONCAT44(fVar23,in_stack_fffffffffffffdf8));
  local_168 = VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar18._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar18._8_56_ = auVar20;
  local_170 = vmovlpd_avx(auVar18._0_16_);
  local_d8 = local_170;
  local_d0 = local_168;
  if (SampleTrowbridgeReitzVisibleArea(pbrt::Vector3<float>const&,float,float,pbrt::Point2<float>const&)
      ::reg == '\0') {
    iVar4 = __cxa_guard_acquire(&SampleTrowbridgeReitzVisibleArea(pbrt::Vector3<float>const&,float,float,pbrt::Point2<float>const&)
                                 ::reg);
    if (iVar4 != 0) {
      SampleTrowbridgeReitzVisibleArea(pbrt::Vector3_const&,float,float,pbrt::Point2_const&)::
      {lambda(pbrt::StatsAccumulator&)#1}::operator_cast_to_function_pointer(&local_171);
      StatRegisterer::StatRegisterer
                (auVar7._8_8_,auVar7._0_8_,(PixelAccumFunc)CONCAT44(s_00,in_stack_fffffffffffffe10))
      ;
      __cxa_guard_release(&SampleTrowbridgeReitzVisibleArea(pbrt::Vector3<float>const&,float,float,pbrt::Point2<float>const&)
                           ::reg);
    }
  }
  *(long *)(*in_FS_OFFSET + -0xa0) = *(long *)(*in_FS_OFFSET + -0xa0) + 1;
  if ((local_d0 == 0.0) && (!NAN(local_d0))) {
    *(long *)(*in_FS_OFFSET + -0xa8) = *(long *)(*in_FS_OFFSET + -0xa8) + 1;
  }
  fVar22 = local_1c * (float)local_d8;
  fVar23 = local_20 * local_d8._4_4_;
  local_194 = 1e-06;
  std::max<float>(&local_194,&local_d0);
  auVar20 = (undefined1  [56])0x0;
  Vector3<float>::Vector3(local_190,fVar23,fVar22,0.0);
  VVar21 = Normalize<float>((Vector3<float> *)CONCAT44(s_00,in_stack_fffffffffffffe10));
  auVar19._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar19._8_56_ = auVar20;
  uVar1 = vmovlpd_avx(auVar19._0_16_);
  TVar3.z = VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
  TVar3.x = (float)(int)uVar1;
  TVar3.y = (float)(int)((ulong)uVar1 >> 0x20);
  return (Vector3f)TVar3;
}

Assistant:

PBRT_CPU_GPU
inline Vector3f SampleTrowbridgeReitzVisibleArea(const Vector3f &w, Float alpha_x,
                                                 Float alpha_y, const Point2f &u) {
    // Section 3.2: transforming the view direction to the hemisphere
    // configuration
    Vector3f wh = Normalize(Vector3f(alpha_x * w.x, alpha_y * w.y, w.z));

    // Section 4.1: orthonormal basis. Can't use CoordinateSystem() since
    // T1 has to be in the tangent plane w.r.t. (0,0,1).
    Vector3f T1 =
        (wh.z < 0.99999f) ? Normalize(Cross(Vector3f(0, 0, 1), wh)) : Vector3f(1, 0, 0);
    Vector3f T2 = Cross(wh, T1);

    // Section 4.2: parameterization of the projected area
    Float r = std::sqrt(u[0]);
    Float phi = 2 * Pi * u[1];
    Float t1 = r * std::cos(phi), t2 = r * std::sin(phi);
    Float s = 0.5f * (1 + wh.z);
    t2 = (1 - s) * std::sqrt(1 - t1 * t1) + s * t2;

    // Section 4.3: reprojection onto hemisphere
    Vector3f nh =
        t1 * T1 + t2 * T2 + std::sqrt(std::max<Float>(0, 1 - t1 * t1 - t2 * t2)) * wh;

    // Section 3.4: transforming the normal back to the ellipsoid configuration
    CHECK_RARE(1e-6, nh.z == 0);
    return Normalize(
        Vector3f(alpha_x * nh.x, alpha_y * nh.y, std::max<Float>(1e-6f, nh.z)));
}